

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source-map.cpp
# Opt level: O1

void __thiscall SourceMapTest_Fibonacci_Test::TestBody(SourceMapTest_Fibonacci_Test *this)

{
  string *sourceMap_00;
  char *in_R9;
  pointer *__ptr;
  size_t location;
  undefined1 local_98 [8];
  optional<wasm::Function::DebugLocation> loc;
  string sourceMap;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  internal local_40 [8];
  AssertionResult gtest_ar_;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_28;
  
  sourceMap_00 = (string *)
                 ((long)&loc.super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
                         _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>.
                         _M_payload._M_value.symbolNameIndex.
                         super__Optional_base<unsigned_int,_true,_true> + 4);
  loc.super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Function::DebugLocation>._16_8_ = &sourceMap._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)sourceMap_00,
             "\n    {\n      \"version\":3,\n      \"sources\":[\"fib.c\"],\n      \"names\":[],\n      \"mappings\": \"moBAEA,4BAKA,QAJA,OADA,OAAA,uCAKA\"\n    }\n  "
             ,"");
  SourceMapTest::parseMap(&this->super_SourceMapTest,sourceMap_00);
  ::wasm::SourceMapReader::readDebugLocationAt((ulong)local_98);
  local_40[0] = (internal)
                (loc.super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload._12_1_ ^ 1);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (loc.super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload._12_1_ != '\0') {
    testing::Message::Message((Message *)&local_28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&sourceMap.field_2 + 8),local_40,
               (AssertionResult *)"loc.has_value()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/source-map.cpp"
               ,0xb2,(char *)sourceMap.field_2._8_8_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sourceMap.field_2._8_8_ != &local_50) {
      operator_delete((void *)sourceMap.field_2._8_8_,local_50._M_allocated_capacity + 1);
    }
    if (local_28._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_28._M_head_impl + 8))();
    }
  }
  if (gtest_ar_._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar_._0_8_);
  }
  SourceMapTest::ExpectDbgLocEq(&this->super_SourceMapTest,0x283,0,3,0,(optional<unsigned_int>)0x0);
  location = 0x284;
  do {
    SourceMapTest::ExpectDbgLocEq
              (&this->super_SourceMapTest,location,0,3,0,(optional<unsigned_int>)0x0);
    location = location + 1;
  } while (location != 0x29f);
  SourceMapTest::ExpectDbgLocEq(&this->super_SourceMapTest,0x29f,0,8,0,(optional<unsigned_int>)0x0);
  SourceMapTest::ExpectDbgLocEq(&this->super_SourceMapTest,0x2a7,0,4,0,(optional<unsigned_int>)0x0);
  SourceMapTest::ExpectDbgLocEq(&this->super_SourceMapTest,0x2ae,0,3,0,(optional<unsigned_int>)0x0);
  SourceMapTest::ExpectDbgLocEq(&this->super_SourceMapTest,0x2b5,0,3,0,(optional<unsigned_int>)0x0);
  SourceMapTest::ExpectDbgLocEq(&this->super_SourceMapTest,0x2dc,0,8,0,(optional<unsigned_int>)0x0);
  SourceMapTest::ExpectDbgLocEq(&this->super_SourceMapTest,0x2dd,0,8,0,(optional<unsigned_int>)0x0);
  SourceMapTest::ExpectDbgLocEq(&this->super_SourceMapTest,9999,0,8,0,(optional<unsigned_int>)0x0);
  if ((size_type *)
      loc.super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Function::DebugLocation>._16_8_ !=
      &sourceMap._M_string_length) {
    operator_delete((void *)loc.super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
                            _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>.
                            _16_8_,sourceMap._M_string_length + 1);
  }
  return;
}

Assistant:

TEST_F(SourceMapTest, Fibonacci) {
  // Test mapping parsing and debug locs
  std::string sourceMap = R"(
    {
      "version":3,
      "sources":["fib.c"],
      "names":[],
      "mappings": "moBAEA,4BAKA,QAJA,OADA,OAAA,uCAKA"
    }
  )";
  parseMap(sourceMap);

  // Location before the first record has no value
  auto loc = reader->readDebugLocationAt(642);
  EXPECT_FALSE(loc.has_value());

  // TODO: These column numbers show as 0 but emsymbolizer.py prints them as 1.
  // Figure out which is right.
  // First location
  ExpectDbgLocEq(643, 0, 3, 0, std::nullopt);
  // locations in between records have the same value as the previous one.
  for (size_t l = 644; l < 671; l++) {
    ExpectDbgLocEq(l, 0, 3, 0, std::nullopt);
  }
  // Subsequent ones are on record boundaries
  ExpectDbgLocEq(671, 0, 8, 0, std::nullopt);
  ExpectDbgLocEq(679, 0, 4, 0, std::nullopt);
  ExpectDbgLocEq(686, 0, 3, 0, std::nullopt);
  ExpectDbgLocEq(693, 0, 3, 0, std::nullopt);
  ExpectDbgLocEq(732, 0, 8, 0, std::nullopt);
  // Entries after the last record have the same value as the last one.
  ExpectDbgLocEq(733, 0, 8, 0, std::nullopt);
  // Should we return empty values for locations that are past the end of the
  // program?
  ExpectDbgLocEq(9999, 0, 8, 0, std::nullopt);
}